

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_buildBlockEntropyStats
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,
                 ZSTD_entropyCTablesMetadata_t *entropyMetadata,void *workspace,size_t wkspSize)

{
  void *workSpace;
  ZSTD_strategy ZVar1;
  BYTE *source;
  BYTE *pBVar2;
  bool bVar3;
  int iVar4;
  uint maxNbBits;
  size_t err_code;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  symbolEncodingType_e sVar10;
  long lVar11;
  size_t err_code_2;
  ulong sourceSize;
  bool bVar12;
  HUF_repeat local_9c;
  ZSTD_symbolEncodingTypeStats_t stats;
  
  ZVar1 = (cctxParams->cParams).strategy;
  bVar12 = true;
  if (cctxParams->literalCompressionMode != ZSTD_ps_enable) {
    if (cctxParams->literalCompressionMode == ZSTD_ps_disable) {
      bVar12 = false;
    }
    else if (ZVar1 == ZSTD_fast) {
      bVar12 = (cctxParams->cParams).targetLength == 0;
    }
  }
  source = seqStorePtr->litStart;
  pBVar2 = seqStorePtr->lit;
  stats.LLtype = 0xff;
  local_9c = (prevEntropy->huf).repeatMode;
  switchD_012e1ce8::default(nextEntropy,prevEntropy,0x810);
  if (!bVar12) {
    (entropyMetadata->hufMetadata).hType = set_basic;
    sVar7 = 0;
    goto LAB_018e4804;
  }
  sourceSize = (long)pBVar2 - (long)source;
  uVar9 = 0x3f;
  if ((prevEntropy->huf).repeatMode == HUF_repeat_valid) {
    uVar9 = 6;
  }
  if (uVar9 < sourceSize) {
    sVar5 = HIST_count_wksp((uint *)workspace,&stats.LLtype,source,sourceSize,workspace,wkspSize);
    bVar12 = false;
    if (sVar5 < 0xffffffffffffff89) {
      sVar10 = set_rle;
      if (sVar5 != sourceSize) {
        sVar10 = set_basic;
        bVar12 = true;
        bVar3 = (sourceSize >> 7) + 4 < sVar5;
        sVar5 = 0;
        if (bVar3) goto LAB_018e4645;
      }
      (entropyMetadata->hufMetadata).hType = sVar10;
      bVar12 = false;
      sVar5 = 0;
    }
LAB_018e4645:
    sVar7 = sVar5;
    if (!bVar12) goto LAB_018e4804;
    workSpace = (void *)((long)workspace + 0x400);
    sVar6 = wkspSize - 0x400;
    if (local_9c == HUF_repeat_check) {
      iVar4 = HUF_validateCTable((HUF_CElt *)prevEntropy,(uint *)workspace,stats.LLtype);
      local_9c = (HUF_repeat)(iVar4 != 0);
    }
    switchD_0130b471::default(nextEntropy,0,0x808);
    maxNbBits = HUF_optimalTableLog(0xb,sourceSize,stats.LLtype,workSpace,sVar6,
                                    (HUF_CElt *)nextEntropy,(uint *)workspace,
                                    (uint)(7 < (int)ZVar1) * 2);
    sVar7 = HUF_buildCTable_wksp
                      ((HUF_CElt *)nextEntropy,(uint *)workspace,stats.LLtype,maxNbBits,workSpace,
                       sVar6);
    if (0xffffffffffffff88 < sVar7) goto LAB_018e4804;
    sVar8 = HUF_estimateCompressedSize((HUF_CElt *)nextEntropy,(uint *)workspace,stats.LLtype);
    sVar6 = HUF_writeCTable_wksp
                      ((entropyMetadata->hufMetadata).hufDesBuffer,0x80,(HUF_CElt *)nextEntropy,
                       stats.LLtype,(uint)sVar7,workSpace,sVar6);
    if (local_9c != HUF_repeat_none) {
      sVar7 = HUF_estimateCompressedSize((HUF_CElt *)prevEntropy,(uint *)workspace,stats.LLtype);
      bVar12 = true;
      if ((sVar7 < sourceSize) && (sourceSize <= sVar6 + 0xc || sVar7 <= sVar8 + sVar6)) {
        switchD_012e1ce8::default(nextEntropy,prevEntropy,0x810);
        (entropyMetadata->hufMetadata).hType = set_repeat;
        bVar12 = false;
        sVar5 = 0;
      }
      sVar7 = sVar5;
      if (!bVar12) goto LAB_018e4804;
    }
    if (sVar8 + sVar6 < sourceSize) {
      (entropyMetadata->hufMetadata).hType = set_compressed;
      (nextEntropy->huf).repeatMode = HUF_repeat_check;
      sVar7 = sVar6;
      goto LAB_018e4804;
    }
    switchD_012e1ce8::default(nextEntropy,prevEntropy,0x810);
  }
  (entropyMetadata->hufMetadata).hType = set_basic;
  sVar7 = 0;
LAB_018e4804:
  (entropyMetadata->hufMetadata).hufDesSize = sVar7;
  if (sVar7 < 0xffffffffffffff89) {
    lVar11 = (long)seqStorePtr->sequences - (long)seqStorePtr->sequencesStart;
    if (lVar11 == 0) {
      stats.size = 0;
      stats.lastCountSize = 0;
      stats.LLtype = 0;
      stats.Offtype = 0;
      stats.MLtype = 0;
      (nextEntropy->fse).litlength_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).offcode_repeatMode = FSE_repeat_none;
      (nextEntropy->fse).matchlength_repeatMode = FSE_repeat_none;
    }
    else {
      ZSTD_buildSequencesStatistics
                (&stats,seqStorePtr,lVar11 >> 3,&prevEntropy->fse,&nextEntropy->fse,
                 (entropyMetadata->fseMetadata).fseTablesBuffer,
                 &(entropyMetadata->fseMetadata).field_0x91,(cctxParams->cParams).strategy,
                 (uint *)workspace,(void *)((long)workspace + 0xd4),wkspSize - 0xd4);
    }
    if (stats.size < 0xffffffffffffff89) {
      (entropyMetadata->fseMetadata).llType = stats.LLtype;
      (entropyMetadata->fseMetadata).ofType = stats.Offtype;
      (entropyMetadata->fseMetadata).mlType = stats.MLtype;
      (entropyMetadata->fseMetadata).lastCountSize = stats.lastCountSize;
    }
    (entropyMetadata->fseMetadata).fseTablesSize = stats.size;
    sVar7 = 0;
    if (0xffffffffffffff88 < stats.size) {
      sVar7 = stats.size;
    }
  }
  return sVar7;
}

Assistant:

size_t ZSTD_buildBlockEntropyStats(
            const seqStore_t* seqStorePtr,
            const ZSTD_entropyCTables_t* prevEntropy,
                  ZSTD_entropyCTables_t* nextEntropy,
            const ZSTD_CCtx_params* cctxParams,
                  ZSTD_entropyCTablesMetadata_t* entropyMetadata,
                  void* workspace, size_t wkspSize)
{
    size_t const litSize = (size_t)(seqStorePtr->lit - seqStorePtr->litStart);
    int const huf_useOptDepth = (cctxParams->cParams.strategy >= HUF_OPTIMAL_DEPTH_THRESHOLD);
    int const hufFlags = huf_useOptDepth ? HUF_flags_optimalDepth : 0;

    entropyMetadata->hufMetadata.hufDesSize =
        ZSTD_buildBlockEntropyStats_literals(seqStorePtr->litStart, litSize,
                                            &prevEntropy->huf, &nextEntropy->huf,
                                            &entropyMetadata->hufMetadata,
                                            ZSTD_literalsCompressionIsDisabled(cctxParams),
                                            workspace, wkspSize, hufFlags);

    FORWARD_IF_ERROR(entropyMetadata->hufMetadata.hufDesSize, "ZSTD_buildBlockEntropyStats_literals failed");
    entropyMetadata->fseMetadata.fseTablesSize =
        ZSTD_buildBlockEntropyStats_sequences(seqStorePtr,
                                              &prevEntropy->fse, &nextEntropy->fse,
                                              cctxParams,
                                              &entropyMetadata->fseMetadata,
                                              workspace, wkspSize);
    FORWARD_IF_ERROR(entropyMetadata->fseMetadata.fseTablesSize, "ZSTD_buildBlockEntropyStats_sequences failed");
    return 0;
}